

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_tests.cc
# Opt level: O3

bool __thiscall
lf::assemble::test::BoundaryAssembler::isActive(BoundaryAssembler *this,Entity *edge)

{
  int iVar1;
  uint *puVar2;
  runtime_error *this_00;
  stringstream ss;
  string local_200;
  string local_1e0;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  iVar1 = (**edge->_vptr_Entity)(edge);
  if (iVar1 == 1) {
    puVar2 = lf::mesh::utils::CodimMeshDataSet<unsigned_int>::operator()
                       (&this->cells_at_edges_,edge);
    return *puVar2 == 1;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Argument must be edge",0x15);
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"edge.Codim() == 1","");
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_200,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/test/assembly_tests.cc"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed(&local_1e0,&local_200,0x1ff,&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"this code should not be reached");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool BoundaryAssembler::isActive(const lf::mesh::Entity &edge) {
  LF_VERIFY_MSG(edge.Codim() == 1, "Argument must be edge");
  return (cells_at_edges_(edge) == 1);
}